

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O1

bool __thiscall HighsLp::needsMods(HighsLp *this,double infinite_cost)

{
  pointer pHVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  bVar3 = true;
  if (this->has_infinite_cost_ == false) {
    pHVar1 = (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((*(int *)&(this->integrality_).
                  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                  super__Vector_impl_data._M_finish == (int)pHVar1) || ((long)this->num_col_ < 1)) {
      return false;
    }
    lVar2 = 0;
    do {
      bVar3 = (pHVar1[lVar2] & ~kInteger) == kSemiContinuous;
      if (bVar3) {
        return bVar3;
      }
      bVar4 = (long)this->num_col_ + -1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
  }
  return bVar3;
}

Assistant:

bool HighsLp::needsMods(const double infinite_cost) const {
  assert(this->has_infinite_cost_ == this->hasInfiniteCost(infinite_cost));
  return this->has_infinite_cost_ || this->hasSemiVariables();
}